

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O0

int Import(WebPPicture *picture,uint8_t *rgb,int rgb_stride,int step,int swap_rb,int import_alpha)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int iVar3;
  int in_EDX;
  uint32_t *in_RSI;
  int *in_RDI;
  int in_R8D;
  int in_R9D;
  uint32_t *dst_1;
  int do_copy;
  uint32_t *dst;
  uint8_t *a_ptr;
  int height;
  int width;
  uint8_t *b_ptr;
  uint8_t *g_ptr;
  uint8_t *r_ptr;
  int y;
  float in_stack_000000b4;
  int in_stack_000000b8;
  int in_stack_000000bc;
  uint8_t *in_stack_000000c0;
  uint8_t *in_stack_000000c8;
  uint8_t *in_stack_000000d0;
  uint8_t *in_stack_000000d8;
  int in_stack_000000f0;
  WebPPicture *in_stack_000000f8;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  uint32_t *local_70;
  uint8_t *local_60;
  uint8_t *local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  int local_2c;
  uint32_t *local_18;
  int local_4;
  
  iVar3 = 0;
  if (in_R8D != 0) {
    iVar3 = 2;
  }
  local_38 = (uint8_t *)((long)in_RSI + (long)iVar3);
  local_40 = (uint8_t *)((long)in_RSI + 1);
  iVar3 = 2;
  if (in_R8D != 0) {
    iVar3 = 0;
  }
  local_48 = (uint8_t *)((long)in_RSI + (long)iVar3);
  iVar3 = in_RDI[2];
  iVar1 = in_RDI[3];
  if (*in_RDI == 0) {
    local_4 = ImportYUVAFromRGBA(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,
                                 in_stack_000000c0,in_stack_000000bc,in_stack_000000b8,
                                 in_stack_000000b4,in_stack_000000f0,in_stack_000000f8);
  }
  else {
    iVar2 = WebPPictureAlloc((WebPPicture *)
                             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (iVar2 == 0) {
      local_4 = 0;
    }
    else {
      VP8LDspInit();
      WebPInitAlphaProcessing();
      if (in_R9D == 0) {
        local_70 = *(uint32_t **)(in_RDI + 0x12);
        for (local_2c = 0; local_2c < iVar1; local_2c = local_2c + 1) {
          (*WebPPackRGB)(local_38,local_40,local_48,iVar3,in_ECX,local_70);
          local_38 = local_38 + in_EDX;
          local_40 = local_40 + in_EDX;
          local_48 = local_48 + in_EDX;
          local_70 = local_70 + in_RDI[0x14];
        }
      }
      else {
        local_60 = *(uint8_t **)(in_RDI + 0x12);
        local_18 = in_RSI;
        if (in_R8D == 0) {
          for (local_2c = 0; local_2c < iVar1; local_2c = local_2c + 1) {
            (*VP8LConvertBGRAToRGBA)(local_18,iVar3,local_60);
            local_18 = (uint32_t *)((long)local_18 + (long)in_EDX);
            local_60 = local_60 + (long)in_RDI[0x14] * 4;
          }
        }
        else {
          for (local_2c = 0; local_2c < iVar1; local_2c = local_2c + 1) {
            memcpy(local_60,local_18,(long)(iVar3 << 2));
            local_18 = (uint32_t *)((long)local_18 + (long)in_EDX);
            local_60 = local_60 + (long)in_RDI[0x14] * 4;
          }
        }
      }
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int Import(WebPPicture* const picture,
                  const uint8_t* rgb, int rgb_stride,
                  int step, int swap_rb, int import_alpha) {
  int y;
  // swap_rb -> b,g,r,a , !swap_rb -> r,g,b,a
  const uint8_t* r_ptr = rgb + (swap_rb ? 2 : 0);
  const uint8_t* g_ptr = rgb + 1;
  const uint8_t* b_ptr = rgb + (swap_rb ? 0 : 2);
  const int width = picture->width;
  const int height = picture->height;

  if (!picture->use_argb) {
    const uint8_t* a_ptr = import_alpha ? rgb + 3 : NULL;
    return ImportYUVAFromRGBA(r_ptr, g_ptr, b_ptr, a_ptr, step, rgb_stride,
                              0.f /* no dithering */, 0, picture);
  }
  if (!WebPPictureAlloc(picture)) return 0;

  VP8LDspInit();
  WebPInitAlphaProcessing();

  if (import_alpha) {
    // dst[] byte order is {a,r,g,b} for big-endian, {b,g,r,a} for little endian
    uint32_t* dst = picture->argb;
    const int do_copy = (ALPHA_OFFSET == 3) && swap_rb;
    assert(step == 4);
    if (do_copy) {
      for (y = 0; y < height; ++y) {
        memcpy(dst, rgb, width * 4);
        rgb += rgb_stride;
        dst += picture->argb_stride;
      }
    } else {
      for (y = 0; y < height; ++y) {
#ifdef WORDS_BIGENDIAN
        // BGRA or RGBA input order.
        const uint8_t* a_ptr = rgb + 3;
        WebPPackARGB(a_ptr, r_ptr, g_ptr, b_ptr, width, dst);
        r_ptr += rgb_stride;
        g_ptr += rgb_stride;
        b_ptr += rgb_stride;
#else
        // RGBA input order. Need to swap R and B.
        VP8LConvertBGRAToRGBA((const uint32_t*)rgb, width, (uint8_t*)dst);
#endif
        rgb += rgb_stride;
        dst += picture->argb_stride;
      }
    }
  } else {
    uint32_t* dst = picture->argb;
    assert(step >= 3);
    for (y = 0; y < height; ++y) {
      WebPPackRGB(r_ptr, g_ptr, b_ptr, width, step, dst);
      r_ptr += rgb_stride;
      g_ptr += rgb_stride;
      b_ptr += rgb_stride;
      dst += picture->argb_stride;
    }
  }
  return 1;
}